

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

char * aaffect_loc_name(int location)

{
  undefined4 in_EDI;
  int *in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  char *local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = "none";
    break;
  case 1:
    local_8 = "temperature";
    break;
  case 2:
    local_8 = "wind";
    break;
  case 3:
    local_8 = "sky";
    break;
  default:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    CLogger::Warn<int&>((CLogger *)CONCAT44(location,in_stack_00000018),
                        (string_view)in_stack_00000020,in_stack_00000010);
    local_8 = "(unknown)";
  }
  return local_8;
}

Assistant:

char *aaffect_loc_name(int location)
{
	switch (location)
	{
		case APPLY_AREA_NONE:
			return "none";
		case APPLY_AREA_SKY:
			return "sky";
		case APPLY_AREA_TEMP:
			return "temperature";
		case APPLY_AREA_WIND:
			return "wind";
	}

	RS.Logger.Warn("aaffect_loc_name: unknown  location {}.", location);
	return "(unknown)";
}